

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::SelectVector
          (ColumnData *this,ColumnScanState *state,Vector *result,idx_t target_count,
          SelectionVector *sel,idx_t sel_count)

{
  ColumnSegment *pCVar1;
  TableScanOptions *pTVar2;
  InternalException *this_00;
  idx_t iVar3;
  idx_t iVar4;
  allocator local_91;
  SelectionVector *local_90;
  idx_t local_88;
  ColumnFetchState fetch_state;
  
  local_90 = sel;
  BeginScanVectorInternal(this,state);
  if (((state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
       super___atomic_base<unsigned_long>._M_i +
      (state->current->super_SegmentBase<duckdb::ColumnSegment>).start) - state->row_index <
      target_count) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&fetch_state,
               "ColumnData::SelectVector should be able to fetch everything from one segment",
               &local_91);
    InternalException::InternalException(this_00,(string *)&fetch_state);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_88 = target_count;
  if ((state->scan_options).ptr != (TableScanOptions *)0x0) {
    pTVar2 = optional_ptr<duckdb::TableScanOptions,_true>::operator->(&state->scan_options);
    if (pTVar2->force_fetch_row == true) {
      for (iVar4 = 0; sel_count != iVar4; iVar4 = iVar4 + 1) {
        iVar3 = iVar4;
        if (local_90->sel_vector != (sel_t *)0x0) {
          iVar3 = (idx_t)local_90->sel_vector[iVar4];
        }
        fetch_state.handles._M_h._M_bucket_count = 1;
        fetch_state.handles._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        fetch_state.handles._M_h._M_element_count = 0;
        fetch_state.handles._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        fetch_state.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        fetch_state.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        fetch_state.child_states.
        super_vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        fetch_state.handles._M_h._M_rehash_policy._M_next_resize = 0;
        fetch_state.handles._M_h._M_single_bucket = (__node_base_ptr)0x0;
        pCVar1 = state->current;
        fetch_state.handles._M_h._M_buckets = &fetch_state.handles._M_h._M_single_bucket;
        (*((pCVar1->function)._M_data)->fetch_row)
                  (pCVar1,&fetch_state,
                   (iVar3 + state->row_index) -
                   (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start,result,iVar4);
        ColumnFetchState::~ColumnFetchState(&fetch_state);
      }
      goto LAB_015404fd;
    }
  }
  ColumnSegment::Select(state->current,state,target_count,result,local_90,sel_count);
LAB_015404fd:
  local_88 = local_88 + state->row_index;
  state->row_index = local_88;
  state->internal_index = local_88;
  return;
}

Assistant:

void ColumnData::SelectVector(ColumnScanState &state, Vector &result, idx_t target_count, const SelectionVector &sel,
                              idx_t sel_count) {
	BeginScanVectorInternal(state);
	if (state.current->start + state.current->count - state.row_index < target_count) {
		throw InternalException("ColumnData::SelectVector should be able to fetch everything from one segment");
	}
	if (state.scan_options && state.scan_options->force_fetch_row) {
		for (idx_t i = 0; i < sel_count; i++) {
			auto source_idx = sel.get_index(i);
			ColumnFetchState fetch_state;
			state.current->FetchRow(fetch_state, UnsafeNumericCast<row_t>(state.row_index + source_idx), result, i);
		}
	} else {
		state.current->Select(state, target_count, result, sel, sel_count);
	}
	state.row_index += target_count;
	state.internal_index = state.row_index;
}